

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O1

void __thiscall QMimeAllGlobPatterns::addGlob(QMimeAllGlobPatterns *this,QMimeGlobPattern *glob)

{
  char16_t *pcVar1;
  QMimeGlobPattern *pQVar2;
  Entry *pEVar3;
  bool bVar4;
  uint uVar5;
  qsizetype qVar6;
  const_iterator cVar7;
  CaseSensitivity cs;
  CaseSensitivity in_R9D;
  QMimeGlobPatternList *this_00;
  QtPrivate *pQVar9;
  QMimeGlobPattern *pQVar10;
  long in_FS_OFFSET;
  QStringView haystack;
  QStringView haystack_00;
  QStringView str;
  QStringView haystack0;
  QStringView haystack0_00;
  QStringView needle0;
  QStringView needle0_00;
  QString local_68;
  TryEmplaceResult local_50;
  char16_t *pcStack_38;
  long local_30;
  TryEmplaceResult *pTVar8;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = glob->m_weight;
  if (uVar5 == 0x32) {
    pcVar1 = (glob->m_pattern).d.ptr;
    pQVar9 = (QtPrivate *)(glob->m_pattern).d.size;
    haystack.m_data = (storage_type_conflict *)0xffffffffffffffff;
    haystack.m_size = (qsizetype)pcVar1;
    qVar6 = QtPrivate::lastIndexOf(pQVar9,haystack,0x2a,L'\x01',in_R9D);
    if (qVar6 == 0) {
      haystack_00.m_data = (storage_type_conflict *)0xffffffffffffffff;
      haystack_00.m_size = (qsizetype)pcVar1;
      qVar6 = QtPrivate::lastIndexOf(pQVar9,haystack_00,0x2e,L'\x01',in_R9D);
      if (qVar6 == 1) {
        local_50.iterator.i.d._0_2_ = 0x3f;
        haystack0.m_data = pcVar1;
        haystack0.m_size = (qsizetype)pQVar9;
        needle0.m_data = (storage_type_conflict *)&local_50;
        needle0.m_size = 1;
        qVar6 = QtPrivate::findString(haystack0,0,needle0,CaseSensitive);
        if (qVar6 == -1) {
          pTVar8 = &local_50;
          local_50.iterator.i.d =
               (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)
               CONCAT62(local_50.iterator.i.d._2_6_,0x5b);
          haystack0_00.m_data = pcVar1;
          haystack0_00.m_size = (qsizetype)pQVar9;
          needle0_00.m_data = (storage_type_conflict *)pTVar8;
          needle0_00.m_size = 1;
          qVar6 = QtPrivate::findString(haystack0_00,0,needle0_00,CaseSensitive);
          cs = (CaseSensitivity)pTVar8;
          if ((qVar6 == -1) && (glob->m_caseSensitivity != CaseSensitive)) {
            local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::mid((QString *)&local_50,&glob->m_pattern,2,-1);
            QString::toLower_helper(&local_68,(QString *)&local_50);
            if (local_50.iterator.i.d != (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)0x0)
            {
              LOCK();
              ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                   ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,2,0x10);
              }
            }
            QHash<QString,QList<QString>>::tryEmplace_impl<QString_const&>
                      (&local_50,(QHash<QString,QList<QString>> *)this,&local_68);
            pEVar3 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
            uVar5 = (uint)(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                          [(uint)local_50.iterator.i.bucket & 0x7f];
            pQVar9 = (QtPrivate *)((pEVar3->storage).data + (ulong)(uVar5 * 0x30) + 0x18);
            str.m_data = (storage_type_conflict *)0x1;
            str.m_size = (qsizetype)(glob->m_mimeType).d.ptr;
            bVar4 = QtPrivate::QStringList_contains
                              (pQVar9,(QStringList *)(glob->m_mimeType).d.size,str,cs);
            if (!bVar4) {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)pQVar9,
                         *(qsizetype *)((pEVar3->storage).data + (ulong)(uVar5 * 0x30) + 0x28),
                         &glob->m_mimeType);
              QList<QString>::end((QList<QString> *)pQVar9);
            }
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
              }
            }
            goto LAB_004b4dda;
          }
        }
      }
    }
  }
  local_50.iterator.i.bucket = (size_t)(glob->m_mimeType).d.ptr;
  local_50.iterator.i.d =
       (Data<QHashPrivate::Node<QString,_QList<QString>_>_> *)(glob->m_mimeType).d.size;
  pcStack_38 = (glob->m_pattern).d.ptr;
  local_50._16_8_ = (glob->m_pattern).d.size;
  if (uVar5 < 0x33) {
    pQVar2 = (this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>.d.ptr;
    pQVar10 = pQVar2 + (this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>.d.size;
    cVar7 = std::
            __find_if<QList<QMimeGlobPattern>::const_iterator,__gnu_cxx::__ops::_Iter_pred<QMimeGlobPatternList::hasPattern(QStringView,QStringView)const::_lambda(QMimeGlobPattern_const&)_1_>>
                      (pQVar2,pQVar10);
    if (cVar7.i != pQVar10) goto LAB_004b4dda;
    qVar6 = (this->m_lowWeightGlobs).super_QList<QMimeGlobPattern>.d.size;
    this_00 = &this->m_lowWeightGlobs;
  }
  else {
    pQVar2 = (this->m_highWeightGlobs).super_QList<QMimeGlobPattern>.d.ptr;
    pQVar10 = pQVar2 + (this->m_highWeightGlobs).super_QList<QMimeGlobPattern>.d.size;
    cVar7 = std::
            __find_if<QList<QMimeGlobPattern>::const_iterator,__gnu_cxx::__ops::_Iter_pred<QMimeGlobPatternList::hasPattern(QStringView,QStringView)const::_lambda(QMimeGlobPattern_const&)_1_>>
                      (pQVar2,pQVar10);
    if (cVar7.i != pQVar10) goto LAB_004b4dda;
    qVar6 = (this->m_highWeightGlobs).super_QList<QMimeGlobPattern>.d.size;
    this_00 = &this->m_highWeightGlobs;
  }
  QtPrivate::QMovableArrayOps<QMimeGlobPattern>::emplace<QMimeGlobPattern_const&>
            ((QMovableArrayOps<QMimeGlobPattern> *)this_00,qVar6,glob);
  QList<QMimeGlobPattern>::end(&this_00->super_QList<QMimeGlobPattern>);
LAB_004b4dda:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeAllGlobPatterns::addGlob(const QMimeGlobPattern &glob)
{
    const QString &pattern = glob.pattern();
    Q_ASSERT(!pattern.isEmpty());

    // Store each patterns into either m_fastPatternDict (*.txt, *.html etc. with default weight 50)
    // or for the rest, like core.*, *.tar.bz2, *~, into highWeightPatternOffset (>50)
    // or lowWeightPatternOffset (<=50)

    if (glob.weight() == 50 && isFastPattern(pattern) && !glob.isCaseSensitive()) {
        // The bulk of the patterns is *.foo with weight 50 --> those go into the fast patterns hash.
        const QString extension = pattern.mid(2).toLower();
        QStringList &patterns = m_fastPatterns[extension]; // find or create
        if (!patterns.contains(glob.mimeType()))
            patterns.append(glob.mimeType());
    } else {
        if (glob.weight() > 50) {
            if (!m_highWeightGlobs.hasPattern(glob.mimeType(), glob.pattern()))
                m_highWeightGlobs.append(glob);
        } else {
            if (!m_lowWeightGlobs.hasPattern(glob.mimeType(), glob.pattern()))
                m_lowWeightGlobs.append(glob);
        }
    }
}